

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

PackageSymbol *
slang::ast::PackageSymbol::fromSyntax
          (Scope *scope,ModuleDeclarationSyntax *syntax,NetType *defaultNetType,
          optional<slang::TimeScale> directiveTimeScale)

{
  MemberSyntax *this;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  bool bVar1;
  ModuleHeaderSyntax *pMVar2;
  reference ppMVar3;
  TimeUnitsDeclarationSyntax *precisionRange_01;
  undefined8 in_RCX;
  Scope *in_RDX;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  PackageImportItemSyntax *item;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *__range5;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> exportDecls;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  bool first;
  PackageSymbol *result;
  optional<slang::ast::VariableLifetime> lifetime;
  Compilation *comp;
  SyntaxNode *in_stack_000003d8;
  Scope *in_stack_000003e0;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffd78;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *in_stack_fffffffffffffd80;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffd88;
  Token *in_stack_fffffffffffffd90;
  VariableLifetime *in_stack_fffffffffffffd98;
  NetType *in_stack_fffffffffffffda0;
  Scope *in_stack_fffffffffffffda8;
  Symbol *in_stack_fffffffffffffdb0;
  Compilation *in_stack_fffffffffffffdb8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdc0;
  undefined1 isFirst;
  Compilation *unitsRange_01;
  Compilation *syntax_01;
  Scope *scope_00;
  PackageSymbol *timeScale;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe60;
  pointer local_160;
  size_t sStack_158;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_100;
  SyntaxNode **local_f8;
  SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> local_f0 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_79;
  undefined4 local_68;
  VariableLifetime local_64;
  SourceLocation local_60;
  string_view local_58;
  PackageSymbol *local_48;
  undefined8 local_40;
  Info *local_38;
  _Optional_payload_base<slang::ast::VariableLifetime> local_30;
  Compilation *local_28;
  Scope *local_20;
  SyntaxNode *local_18;
  undefined8 local_10;
  undefined4 local_5;
  undefined1 local_1;
  
  local_5 = (undefined4)in_RCX;
  local_1 = (undefined1)((ulong)in_RCX >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = Scope::getCompilation(in_RDI);
  pMVar2 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xbf2deb);
  local_40._0_2_ = (pMVar2->lifetime).kind;
  local_40._2_1_ = (pMVar2->lifetime).field_0x2;
  local_40._3_1_ = (pMVar2->lifetime).numFlags;
  local_40._4_4_ = (pMVar2->lifetime).rawLen;
  local_38 = (pMVar2->lifetime).info;
  token.info = (Info *)in_stack_fffffffffffffd88;
  token._0_8_ = in_stack_fffffffffffffd80;
  local_30 = (_Optional_payload_base<slang::ast::VariableLifetime>)
             SemanticFacts::getVariableLifetime(token);
  unitsRange_01 = local_28;
  syntax_01 = local_28;
  not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xbf2e51);
  local_58 = parsing::Token::valueText(in_stack_fffffffffffffd90);
  pMVar2 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xbf2e7e);
  local_60 = parsing::Token::location(&pMVar2->name);
  local_68 = 1;
  local_64 = std::optional<slang::ast::VariableLifetime>::value_or<slang::ast::VariableLifetime>
                       ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffd88,
                        (VariableLifetime *)in_stack_fffffffffffffd80);
  local_48 = BumpAllocator::
             emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                       ((BumpAllocator *)in_stack_fffffffffffffdc0._M_extent_value,
                        in_stack_fffffffffffffdb8,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_fffffffffffffdb0,(SourceLocation *)in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  Symbol::setSyntax(&local_48->super_Symbol,local_18);
  timeScale = local_48;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffdc0._M_extent_value;
  syntax_00._M_ptr = (pointer)in_stack_fffffffffffffdb8;
  Symbol::setAttributes(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,syntax_00);
  local_79 = 1;
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xbf2f8e);
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xbf2f9b);
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> *)0xbf2fa8);
  local_f8 = &local_18[3].previewNode;
  local_100._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffd78);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffd88);
  scope_00 = local_20;
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_100);
    this = *ppMVar3;
    if ((this->super_SyntaxNode).kind == TimeUnitsDeclaration) {
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0xbf304e);
      if (!bVar1) {
        std::optional<slang::TimeScale>::emplace<>
                  ((optional<slang::TimeScale> *)in_stack_fffffffffffffd80);
      }
      std::optional<slang::TimeScale>::operator*((optional<slang::TimeScale> *)0xbf3077);
      isFirst = local_10._7_1_;
      precisionRange_01 =
           slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                     (&this->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                ((TimeScale *)timeScale,scope_00,(TimeUnitsDeclarationSyntax *)syntax_01,
                 (optional<slang::SourceRange> *)unitsRange_01,
                 (optional<slang::SourceRange> *)precisionRange_01,(bool)isFirst);
    }
    else {
      local_79 = 0;
      if ((this->super_SyntaxNode).kind == PackageExportAllDeclaration) {
        local_48->hasExportAll = true;
      }
      else if ((this->super_SyntaxNode).kind == PackageExportDeclaration) {
        slang::syntax::SyntaxNode::as<slang::syntax::PackageExportDeclarationSyntax>
                  (&this->super_SyntaxNode);
        slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)0xbf3185);
        slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::end
                  (in_stack_fffffffffffffd80);
        while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>_>
                                 ((self_type *)in_stack_fffffffffffffd80,
                                  (iterator_base<slang::syntax::PackageImportItemSyntax_*> *)
                                  in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
          ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
                       *)0xbf3212);
          SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::push_back
                    ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)
                     in_stack_fffffffffffffd80,(PackageImportItemSyntax **)in_stack_fffffffffffffd78
                    );
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_false>
                      *)in_stack_fffffffffffffd80);
        }
      }
      Scope::addMembers(in_stack_000003e0,in_stack_000003d8);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_100);
  }
  SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::copy
            (local_f0,(EVP_PKEY_CTX *)local_28,src);
  std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::PackageImportItemSyntax_*,_18446744073709551615UL>
            ((span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffd90,
             (span<const_slang::syntax::PackageImportItemSyntax_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffd88);
  (local_48->exportDecls)._M_ptr = local_160;
  (local_48->exportDecls)._M_extent._M_extent_value = sStack_158;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._5_3_ =
       (int3)((uint)in_stack_fffffffffffffe44 >> 8);
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._4_1_ = local_1;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_ = local_5;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       (SourceLocation)local_b0;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._16_8_ = uStack_a8;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       (SourceLocation)in_stack_fffffffffffffe60;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       (SourceLocation)local_a0;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._16_8_ = local_98;
  SemanticFacts::populateTimeScale
            ((optional<slang::TimeScale> *)scope_00,(Scope *)syntax_01,
             (_Optional_base<slang::TimeScale,_true,_true>)SUB85((ulong)timeScale >> 0x18,0),
             unitsRange_00,precisionRange_00);
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> *)0xbf33e0);
  return local_48;
}

Assistant:

PackageSymbol& PackageSymbol::fromSyntax(const Scope& scope, const ModuleDeclarationSyntax& syntax,
                                         const NetType& defaultNetType,
                                         std::optional<TimeScale> directiveTimeScale) {
    auto& comp = scope.getCompilation();
    auto lifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime);
    auto result = comp.emplace<PackageSymbol>(comp, syntax.header->name.valueText(),
                                              syntax.header->name.location(), defaultNetType,
                                              lifetime.value_or(VariableLifetime::Static));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;
    SmallVector<const PackageImportItemSyntax*> exportDecls;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!result->timeScale)
                result->timeScale.emplace();

            SemanticFacts::populateTimeScale(*result->timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;

        if (member->kind == SyntaxKind::PackageExportAllDeclaration) {
            result->hasExportAll = true;
        }
        else if (member->kind == SyntaxKind::PackageExportDeclaration) {
            for (auto item : member->as<PackageExportDeclarationSyntax>().items)
                exportDecls.push_back(item);
        }

        result->addMembers(*member);
    }

    result->exportDecls = exportDecls.copy(comp);

    SemanticFacts::populateTimeScale(result->timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
    return *result;
}